

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char,capnp::Text::Reader>
          (StringTree *__return_storage_ptr__,kj *this,char *params,Reader *params_1)

{
  kj local_19;
  FixedArray<char,_1UL> local_18 [8];
  ArrayPtr<const_char> *local_10;
  
  local_19 = *this;
  local_18 = *(FixedArray<char,_1UL> (*) [8])params;
  local_10 = (ArrayPtr<const_char> *)(*(long *)(params + 8) + -1);
  StringTree::concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_19,local_18,local_10);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}